

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

string * __thiscall
pbrt::BilinearPatchMesh::ToString_abi_cxx11_(string *__return_storage_ptr__,BilinearPatchMesh *this)

{
  int *args_1;
  int *args_2;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string np;
  span<const_int> local_80;
  span<const_pbrt::Point2<float>_> local_70;
  span<const_pbrt::Normal3<float>_> local_60;
  span<const_pbrt::Point3<float>_> local_50;
  span<const_int> local_40;
  
  np._M_dataplus._M_p = (pointer)&np.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&np,"(nullptr)","");
  args_1 = &this->nPatches;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  if (this->vertexIndices == (int *)0x0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,np._M_dataplus._M_p,np._M_dataplus._M_p + np._M_string_length);
  }
  else {
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_40.n = (long)*args_1 << 2;
    local_40.ptr = this->vertexIndices;
    detail::stringPrintfRecursive<pstd::span<int_const>>(&local_e0,"%s",&local_40);
  }
  local_50.ptr = this->p;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  if (local_50.ptr == (Point3f *)0x0) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  args_2 = &this->nVertices;
  local_50.n = (size_t)*args_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pstd::span<pbrt::Point3<float>const>>(&local_100,"%s",&local_50);
  local_60.ptr = this->n;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  if (local_60.ptr == (Normal3f *)0x0) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  local_60.n = (size_t)*args_2;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pstd::span<pbrt::Normal3<float>const>>(&local_120,"%s",&local_60);
  local_70.ptr = this->uv;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  if (local_70.ptr != (Point2f *)0x0) {
    local_70.n = (size_t)*args_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<pstd::span<pbrt::Point2<float>const>>(&local_c0,"%s",&local_70);
    local_80.ptr = this->faceIndices;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    if (local_80.ptr != (int *)0x0) {
      local_80.n = (size_t)*args_1;
      local_140._M_string_length = 0;
      local_140.field_2._M_local_buf[0] = '\0';
      detail::stringPrintfRecursive<pstd::span<int_const>>(&local_140,"%s",&local_80);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      detail::
      stringPrintfRecursive<bool_const&,bool_const&,int_const&,int_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (__return_storage_ptr__,
                 "[ BilinearMatchMesh reverseOrientation: %s transformSwapsHandedness: %s nPatches: %d nVertices: %d vertexIndices: %s p: %s n: %s uv: %s faceIndices: %s ]"
                 ,&this->reverseOrientation,&this->transformSwapsHandedness,args_1,args_2,&local_e0,
                 &local_100,&local_120,&local_c0,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,
                        CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                 local_140.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                 local_120.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                 local_100.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                 local_e0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)np._M_dataplus._M_p != &np.field_2) {
        operator_delete(np._M_dataplus._M_p,np.field_2._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  std::__throw_logic_error("basic_string::_M_construct null not valid");
}

Assistant:

std::string BilinearPatchMesh::ToString() const {
    std::string np = "(nullptr)";
    return StringPrintf(
        "[ BilinearMatchMesh reverseOrientation: %s transformSwapsHandedness: "
        "%s "
        "nPatches: %d nVertices: %d vertexIndices: %s p: %s n: %s "
        "uv: %s faceIndices: %s ]",
        reverseOrientation, transformSwapsHandedness, nPatches, nVertices,
        vertexIndices ? StringPrintf("%s", pstd::MakeSpan(vertexIndices, 4 * nPatches))
                      : np,
        p ? StringPrintf("%s", pstd::MakeSpan(p, nVertices)) : nullptr,
        n ? StringPrintf("%s", pstd::MakeSpan(n, nVertices)) : nullptr,
        uv ? StringPrintf("%s", pstd::MakeSpan(uv, nVertices)) : nullptr,
        faceIndices ? StringPrintf("%s", pstd::MakeSpan(faceIndices, nPatches))
                    : nullptr);
}